

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask25_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  
  uVar1 = in[1];
  vpmovsxbd_avx(ZEXT416(0x48342410));
  vpmovsxbd_avx512f(_DAT_001a1360);
  auVar6 = vpmovsxbd_avx512f(_DAT_001a1370);
  uVar2 = in[0x17];
  *out = uVar1 << 0x19 | *in;
  uVar3 = in[0x16];
  auVar5 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar1));
  auVar4 = vpsllvd_avx2(auVar5,_DAT_001a1340);
  auVar5 = vpmovsxbd_avx(ZEXT416(0xc080501));
  auVar7 = vpgatherdd_avx512f(*in);
  auVar8 = vpsllvd_avx512f(auVar7,_DAT_001a2a00);
  auVar9 = vpermd_avx512f(ZEXT1664(auVar5),auVar7);
  auVar5 = vpsrlvd_avx2(auVar9._0_16_,_DAT_00198340);
  auVar4 = vpor_avx(auVar4,auVar5);
  auVar9 = valignd_avx512f(auVar7,auVar7,0xf);
  auVar5 = vpinsrd_avx(auVar9._0_16_,uVar1,0);
  auVar9 = vinserti32x4_avx512f(auVar9,auVar5,0);
  auVar9 = vpsrlvd_avx512f(auVar9,_DAT_001a2980);
  auVar6 = vpermi2d_avx512f(auVar6,auVar9,ZEXT1664(auVar4));
  auVar5 = vextracti32x4_avx512f(auVar7,3);
  auVar6 = vpord_avx512f(auVar8,auVar6);
  auVar6 = vmovdqu64_avx512f(auVar6);
  *(undefined1 (*) [64])(out + 1) = auVar6;
  out[0x11] = uVar2 << 0x1f | uVar3 << 6 | auVar5._12_4_ >> 0x13;
  out[0x12] = uVar2 >> 1;
  return out + 0x13;
}

Assistant:

uint32_t *__fastpackwithoutmask25_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (25 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (25 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (25 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (25 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (25 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (25 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (25 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (25 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (25 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (25 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (25 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (25 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (25 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++out;
  *out = ((*in)) >> (25 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (25 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (25 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++out;
  *out = ((*in)) >> (25 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (25 - 24);
  ++in;

  return out + 1;
}